

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O0

int __thiscall
FrobTadsApplication::runTads
          (FrobTadsApplication *this,char *filename,int vm,int argc,char **argv,char *savedState,
          TadsNetConfig *netconfig)

{
  bool bVar1;
  pointer __dest;
  type pathbuf;
  int in_EDX;
  char *in_RSI;
  long *in_RDI;
  TadsNetConfig *in_stack_00000028;
  char *in_stack_00000030;
  char **in_stack_00000038;
  int in_stack_00000044;
  char *in_stack_00000048;
  int vmRet;
  int tmpColor;
  __array gameDirBuf;
  __array finalFilename;
  char *finalFilenamePtr;
  size_t filenameLen;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_98;
  uint in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int iVar2;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar3;
  FrobTadsApplication *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  
  strlen(in_RSI);
  std::make_unique<char[]>(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  __dest = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  strcpy(__dest,in_RSI);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if ((*(byte *)((long)in_RDI + 0xd) & 1) != 0) {
    std::make_unique<char[]>(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pathbuf = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                        ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *pathbuf = '\0';
    std::unique_ptr<char[],_std::default_delete<char[]>_>::get
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    os_get_path_name(pathbuf,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (char *)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff90 = (int)pathbuf;
    std::unique_ptr<char[],_std::default_delete<char[]>_>::get
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    bVar1 = changeDirectory((FrobTadsApplication *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (char *)0x219e53);
    in_stack_ffffffffffffff8c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff8c);
    if (bVar1) {
      std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      in_stack_ffffffffffffff80 =
           (FrobTadsApplication *)
           os_get_root_name((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  (**(code **)*in_RDI)();
  G_oss_screen_width = (**(code **)(*in_RDI + 0x58))();
  iVar3 = G_oss_screen_width;
  G_oss_screen_height = (**(code **)(*in_RDI + 0x50))();
  iVar2 = G_oss_screen_height;
  osssbini(in_stack_ffffffffffffff74);
  ossgetcolor(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
              (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  ossdsp(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
         (char *)0x219f57);
  (*globalApp->_vptr_FrobTadsApplication[4])();
  ossgetcolor(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
              (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  ossdsp(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
         (char *)0x219fa0);
  (*globalApp->_vptr_FrobTadsApplication[4])();
  if (in_EDX == 0) {
    local_98 = fRunTads2(in_stack_ffffffffffffff80,(char *)CONCAT44(iVar3,iVar2));
  }
  else {
    in_stack_ffffffffffffff64 =
         fRunTads3(_tmpColor,in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030
                   ,in_stack_00000028);
    local_98 = in_stack_ffffffffffffff64;
  }
  os_expause();
  osssbdel();
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(in_stack_ffffffffffffff64,local_98));
  return local_98;
}

Assistant:

int
FrobTadsApplication::runTads( const char* filename, int vm, int argc, const char *const *argv,
                              const char* savedState, class TadsNetConfig* netconfig )
{
    // We might strip the path from the filename later, in case we
    // change the current directory.
    size_t filenameLen = strlen(filename);
    char* finalFilenamePtr;
    const auto finalFilename = std::make_unique<char[]>(filenameLen + 1);
    strcpy(finalFilename.get(), filename);
    finalFilenamePtr = finalFilename.get();

    // We'll try setting the current directory to the game's
    // directory (if the user didn't tell us not to).
    if (this->options.changeDir) {
        const auto gameDirBuf = std::make_unique<char[]>(filenameLen + 1);
        gameDirBuf[0] = '\0'; // Paranoia.
        os_get_path_name(gameDirBuf.get(), filenameLen, filename);
        // Try changing the current directory.
        if (this->changeDirectory(gameDirBuf.get())) {
            // Success.  Since we changed the current
            // directory, we must adapt the filename by
            // stripping it from its path.  For this
            // purpose, we'll just store the position of the
            // filename's first character.
            finalFilenamePtr = os_get_root_name(finalFilename.get());
        }
    }

    // Initialize the screen.
    this->init();

    // The osgen layer uses these global variables to determine the
    // size of the screen; set them to the width and height of our
    // game window.
    G_oss_screen_width = this->width();
    G_oss_screen_height = this->height();

    // Initialize the osgen scrollback buffer.
    osssbini(this->options.scrollBufSize);

    // A kludge to circumvent a curses color problem; display one
    // character in reverse video then one in normal colors.  This
    // avoids the problem where the first block of text is shown in
    // wrong colors.
    int tmpColor = ossgetcolor(OSGEN_COLOR_STATUSLINE, OSGEN_COLOR_STATUSBG, 0, 0);
    ossdsp(0, 0, tmpColor, " ");
    globalApp->flush();
    tmpColor = ossgetcolor(OSGEN_COLOR_TEXT, OSGEN_COLOR_TEXTBG, 0, 0);
    ossdsp(0, 0, tmpColor, " ");
    globalApp->flush();

    // Run the VM.
    int vmRet = vm == 0 ? this->fRunTads2(finalFilenamePtr)
                        : this->fRunTads3(finalFilenamePtr, argc, argv, savedState, netconfig);

    // Pause.
    os_expause();

    // Delete the scrollback buffer.
    osssbdel();

    // Return the VM's exit code.
    return vmRet;
}